

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

iterator_base<true> * __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::
make_begin_iterator<pstore::database_const&,pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const&,pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>>
          (iterator_base<true> *__return_storage_ptr__,
          hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
          *this,database *db,
          hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          *m)

{
  index_pointer node;
  
  memset(&__return_storage_ptr__->visited_parents_,0,0xd8);
  __return_storage_ptr__->db_ = (database_reference)this;
  __return_storage_ptr__->index_ =
       (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
        *)db;
  (__return_storage_ptr__->pos_)._M_t.
  super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
  .super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>.
  _M_head_impl = (pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *)0x0;
  node = (index_pointer)
         (db->storage_).file_.
         super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (node.internal_ != (internal_node *)0x0) {
    hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::iterator_base<true>::move_to_left_most_child(__return_storage_ptr__,node);
  }
  return __return_storage_ptr__;
}

Assistant:

Iterator hamt_map<KeyType, ValueType, Hash, KeyEqual>::make_begin_iterator (Database && db,
                                                                                    HamtMap && m) {
            Iterator result{db, parent_stack (), &m};
            if (!m.root_.is_empty ()) {
                result.move_to_left_most_child (m.root_);
            }
            return result;
        }